

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visualizer.cpp
# Opt level: O0

Vector4 * __thiscall iDynTree::ColorViz::toVector4(ColorViz *this)

{
  float fVar1;
  double *pdVar2;
  float *in_RSI;
  VectorFixSize<4U> *in_RDI;
  Vector4 *ret;
  
  VectorFixSize<4U>::VectorFixSize(in_RDI);
  fVar1 = *in_RSI;
  pdVar2 = VectorFixSize<4U>::operator()(in_RDI,0);
  *pdVar2 = (double)fVar1;
  fVar1 = in_RSI[1];
  pdVar2 = VectorFixSize<4U>::operator()(in_RDI,1);
  *pdVar2 = (double)fVar1;
  fVar1 = in_RSI[2];
  pdVar2 = VectorFixSize<4U>::operator()(in_RDI,2);
  *pdVar2 = (double)fVar1;
  fVar1 = in_RSI[3];
  pdVar2 = VectorFixSize<4U>::operator()(in_RDI,3);
  *pdVar2 = (double)fVar1;
  return in_RDI;
}

Assistant:

Vector4 ColorViz::toVector4() const
{
    Vector4 ret;
    ret(0) = r;
    ret(1) = g;
    ret(2) = b;
    ret(3) = a;
    return ret;
}